

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::SkipMessageSetField
               (CodedInputStream *input,uint32_t field_number,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  string *buffer;
  uint32_t length;
  uint32_t local_1c;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_1c);
  if (bVar1) {
    buffer = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(unknown_fields,field_number);
    bVar1 = io::CodedInputStream::ReadString(input,buffer,local_1c);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormat::SkipMessageSetField(io::CodedInputStream* input,
                                     uint32_t field_number,
                                     UnknownFieldSet* unknown_fields) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  return input->ReadString(unknown_fields->AddLengthDelimited(field_number),
                           length);
}